

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dupcat.c
# Opt level: O1

char * dupcat_fn(char *s1,...)

{
  char in_AL;
  size_t sVar1;
  ulong uVar2;
  void **ppvVar3;
  size_t sVar4;
  char *__dest;
  void **ppvVar5;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *__dest_00;
  uint uVar6;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  void **local_100;
  void *local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_e8[1] = (void *)in_RSI;
  local_e8[2] = (void *)in_RDX;
  local_e8[3] = (void *)in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  sVar1 = strlen(s1);
  ppvVar5 = &ap[0].overflow_arg_area;
  uVar6 = 8;
  while( true ) {
    if (uVar6 < 0x29) {
      uVar2 = (ulong)uVar6;
      uVar6 = uVar6 + 8;
      ppvVar3 = (void **)((long)local_e8 + uVar2);
    }
    else {
      ppvVar3 = ppvVar5;
      ppvVar5 = ppvVar5 + 1;
    }
    if ((char *)*ppvVar3 == (char *)0x0) break;
    sVar4 = strlen((char *)*ppvVar3);
    sVar1 = ((long)(sVar1 << 0x20) >> 0x20) + sVar4;
  }
  __dest = (char *)safemalloc((long)((sVar1 << 0x20) + 0x100000000) >> 0x20,1,0);
  strcpy(__dest,s1);
  sVar1 = strlen(__dest);
  __dest_00 = __dest + sVar1;
  uVar6 = 8;
  local_100 = &ap[0].overflow_arg_area;
  while( true ) {
    uVar2 = (ulong)uVar6;
    if (uVar2 < 0x29) {
      uVar6 = uVar6 + 8;
      ppvVar5 = (void **)((long)local_e8 + uVar2);
    }
    else {
      ppvVar5 = local_100;
      local_100 = local_100 + 1;
    }
    if ((char *)*ppvVar5 == (char *)0x0) break;
    strcpy(__dest_00,(char *)*ppvVar5);
    sVar1 = strlen(__dest_00);
    __dest_00 = __dest_00 + sVar1;
  }
  return __dest;
}

Assistant:

char *dupcat_fn(const char *s1, ...)
{
    int len;
    char *p, *q, *sn;
    va_list ap;

    len = strlen(s1);
    va_start(ap, s1);
    while (1) {
        sn = va_arg(ap, char *);
        if (!sn)
            break;
        len += strlen(sn);
    }
    va_end(ap);

    p = snewn(len + 1, char);
    strcpy(p, s1);
    q = p + strlen(p);

    va_start(ap, s1);
    while (1) {
        sn = va_arg(ap, char *);
        if (!sn)
            break;
        strcpy(q, sn);
        q += strlen(q);
    }
    va_end(ap);

    return p;
}